

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::NotImplementedException::NotImplementedException<unsigned_long>
          (NotImplementedException *this,string *msg,unsigned_long params)

{
  unsigned_long in_RSI;
  string *in_RDI;
  NotImplementedException *this_00;
  NotImplementedException local_38 [2];
  
  this_00 = local_38;
  Exception::ConstructMessage<unsigned_long>(in_RDI,in_RSI);
  NotImplementedException(this_00,in_RDI);
  ::std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}